

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  bool bVar1;
  TestResult *pTVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  TestResult *in_RDI;
  int i;
  bool comma;
  string kIndent;
  string kTestsuites;
  int in_stack_fffffffffffffc9c;
  UnitTest *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffccc;
  undefined8 in_stack_fffffffffffffd78;
  allocator *paVar6;
  undefined1 uVar7;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined8 in_stack_fffffffffffffd88;
  TestResult *result;
  string *in_stack_fffffffffffffd90;
  string *name;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  ostream *in_stack_fffffffffffffda0;
  TestResult *stream_00;
  int local_230;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [8];
  TimeInMillis in_stack_fffffffffffffe48;
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [8];
  TimeInMillis in_stack_ffffffffffffff08;
  undefined1 local_d9 [40];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  TestCase *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [40];
  TestResult *local_8;
  
  uVar7 = (undefined1)((ulong)in_stack_fffffffffffffd78 >> 0x38);
  iVar4 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"testsuites",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Indent_abi_cxx11_(in_stack_fffffffffffffccc);
  std::operator<<((ostream *)local_8,"{\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"tests",&local_89);
  UnitTest::reportable_test_count((UnitTest *)0x15f481);
  OutputJsonKey(in_stack_fffffffffffffda0,
                (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                in_stack_fffffffffffffd90,iVar4,
                (string *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),(bool)uVar7)
  ;
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  stream_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"failures",&local_b1);
  iVar3 = UnitTest::failed_test_count((UnitTest *)0x15f528);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),
                in_stack_fffffffffffffd90,iVar4,
                (string *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),(bool)uVar7)
  ;
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  name = (string *)local_d9;
  result = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_d9 + 1),"disabled",(allocator *)name);
  iVar4 = UnitTest::reportable_disabled_test_count((UnitTest *)0x15f5cf);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                (int)((ulong)result >> 0x20),(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),
                (bool)uVar7);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  paVar6 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"errors",paVar6);
  uVar7 = (undefined1)((ulong)paVar6 >> 0x38);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                (int)((ulong)result >> 0x20),(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),
                (bool)uVar7);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"random_seed",&local_129);
    UnitTest::random_seed((UnitTest *)0x15f70f);
    OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                  (int)((ulong)result >> 0x20),(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),
                  (bool)uVar7);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"timestamp",&local_151);
  UnitTest::start_timestamp((UnitTest *)0x15f980);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_ffffffffffffff08);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                (string *)result,(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),(bool)uVar7);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"time",&local_199);
  UnitTest::elapsed_time((UnitTest *)0x15fa4d);
  FormatTimeInMillisAsDuration_abi_cxx11_(in_stack_fffffffffffffe48);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                (string *)result,(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),(bool)uVar7);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pTVar2 = local_8;
  UnitTest::ad_hoc_test_result((UnitTest *)0x15fae4);
  TestPropertiesAsJson(result,(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80));
  poVar5 = std::operator<<((ostream *)pTVar2,local_1e0);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"name",&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"AllTests",&local_229);
  OutputJsonKey((ostream *)stream_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffd98),name,
                (string *)result,(string *)CONCAT44(iVar4,in_stack_fffffffffffffd80),(bool)uVar7);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  poVar5 = std::operator<<((ostream *)local_8,local_68);
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,local_30);
  std::operator<<(poVar5,"\": [\n");
  bVar1 = false;
  local_230 = 0;
  while( true ) {
    iVar3 = UnitTest::total_test_case_count((UnitTest *)0x15fca1);
    if (iVar3 <= local_230) break;
    UnitTest::GetTestCase(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
    iVar3 = TestCase::reportable_test_count((TestCase *)0x15fcdc);
    if (0 < iVar3) {
      if (bVar1) {
        std::operator<<((ostream *)local_8,",\n");
      }
      else {
        bVar1 = true;
      }
      UnitTest::GetTestCase(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      PrintJsonTestCase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    local_230 = local_230 + 1;
  }
  poVar5 = std::operator<<((ostream *)local_8,"\n");
  poVar5 = std::operator<<(poVar5,local_68);
  poVar5 = std::operator<<(poVar5,"]\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_case_count(); ++i) {
    if (unit_test.GetTestCase(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestCase(stream, *unit_test.GetTestCase(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}